

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grammar.cpp
# Opt level: O1

int __thiscall
Centaurus::Grammar<unsigned_char>::parse(Grammar<unsigned_char> *this,char *filename,int machine_id)

{
  wchar_t wVar1;
  int iVar2;
  wchar_t wVar3;
  StreamException *pSVar4;
  vector<Centaurus::Identifier,_std::allocator<Centaurus::Identifier>_> *__n;
  ATNMachine<unsigned_char> atn;
  wstring wide_path;
  Identifier id;
  Encoder enc;
  wstring grammar_str;
  Stream stream;
  wifstream grammar_file;
  allocator local_3b1;
  Grammar<unsigned_char> *local_3b0;
  undefined1 local_3a8 [8];
  undefined1 local_3a0 [24];
  int local_388;
  undefined **local_380;
  undefined1 *local_378;
  undefined4 local_370 [2];
  undefined1 local_368 [16];
  undefined **local_358;
  vector<Centaurus::ATNNode<unsigned_char>,_std::allocator<Centaurus::ATNNode<unsigned_char>_>_>
  local_350;
  int local_338;
  Identifier local_330;
  wstring *local_308;
  char *local_300;
  Identifier *local_2f8;
  vector<Centaurus::Identifier,_std::allocator<Centaurus::Identifier>_> *local_2f0;
  _Hashtable<Centaurus::Identifier,std::pair<Centaurus::Identifier_const,Centaurus::ATNMachine<unsigned_char>>,std::allocator<std::pair<Centaurus::Identifier_const,Centaurus::ATNMachine<unsigned_char>>>,std::__detail::_Select1st,std::equal_to<Centaurus::Identifier>,std::hash<Centaurus::Identifier>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  *local_2e8;
  Encoder local_2e0;
  undefined1 *local_2d8;
  long local_2d0;
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [8];
  _Alloc_hider local_2b0;
  wchar_t local_2a0 [4];
  iterator local_290;
  undefined8 local_288;
  bool local_280;
  string local_278;
  string local_258;
  long local_238 [29];
  undefined8 auStack_150 [36];
  
  local_3b0 = this;
  local_300 = filename;
  std::wifstream::wifstream(local_238,filename,_S_in);
  local_2d8 = local_2c8;
  std::__cxx11::wstring::_M_construct<std::istreambuf_iterator<wchar_t,std::char_traits<wchar_t>>>
            ((wstring *)&local_2d8,
             *(undefined8 *)((long)auStack_150 + *(long *)(local_238[0] + -0x18)),0xffffffff,0,
             0xffffffff);
  local_2b8 = (undefined1  [8])&PTR__Stream_001c8898;
  local_2b0._M_p = local_2a0;
  std::__cxx11::wstring::_M_construct<wchar_t*>
            ((wstring *)&local_2b0,local_2d8,local_2d8 + local_2d0 * 4);
  local_288._0_4_ = 1;
  local_288._4_4_ = 0;
  local_280 = false;
  local_290._M_current = local_2b0._M_p;
  local_308 = (wstring *)&(local_3b0->m_root_id).m_id;
  local_2e8 = (_Hashtable<Centaurus::Identifier,std::pair<Centaurus::Identifier_const,Centaurus::ATNMachine<unsigned_char>>,std::allocator<std::pair<Centaurus::Identifier_const,Centaurus::ATNMachine<unsigned_char>>>,std::__detail::_Select1st,std::equal_to<Centaurus::Identifier>,std::hash<Centaurus::Identifier>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
               *)&local_3b0->m_networks;
  __n = &local_3b0->m_identifiers;
  local_2f8 = &local_3b0->m_grammar_name;
  local_2f0 = __n;
  do {
    wVar1 = Stream::skip_whitespace((Stream *)local_2b8);
    if (wVar1 != L'\0') {
      if (0xffff < machine_id) {
        pSVar4 = (StreamException *)__cxa_allocate_exception(0x28);
        Stream::toomany(pSVar4,(Stream *)local_2b8,0xffff);
        __cxa_throw(pSVar4,&StreamException::typeinfo,StreamException::~StreamException);
      }
      Identifier::Identifier(&local_330,(Stream *)local_2b8);
      iVar2 = std::__cxx11::wstring::compare((wchar_t *)&local_330.m_id);
      if (iVar2 == 0) {
        Stream::skip_whitespace((Stream *)local_2b8);
        Identifier::parse(local_2f8,(Stream *)local_2b8);
        wVar3 = Stream::skip_whitespace((Stream *)local_2b8);
        if (wVar3 != L';') {
          pSVar4 = (StreamException *)__cxa_allocate_exception(0x28);
          Stream::unexpected(pSVar4,(Stream *)local_2b8,wVar3);
          __cxa_throw(pSVar4,&StreamException::typeinfo,StreamException::~StreamException);
        }
        Stream::get((Stream *)local_2b8);
      }
      else {
        iVar2 = std::__cxx11::wstring::compare((wchar_t *)&local_330.m_id);
        if (iVar2 == 0) {
          wVar3 = Stream::skip_whitespace((Stream *)local_2b8);
          if (wVar3 != L'\"') {
            pSVar4 = (StreamException *)__cxa_allocate_exception(0x28);
            Stream::unexpected(pSVar4,(Stream *)local_2b8,wVar3);
            __cxa_throw(pSVar4,&StreamException::typeinfo,StreamException::~StreamException);
          }
          Stream::get((Stream *)local_2b8);
          local_380 = (undefined **)local_370;
          local_378 = (undefined1 *)0x0;
          local_370[0] = 0;
          while( true ) {
            wVar3 = Stream::get((Stream *)local_2b8);
            if (wVar3 == L'\"') break;
            std::__cxx11::wstring::push_back((wchar_t)&local_380);
          }
          wVar3 = Stream::skip_whitespace((Stream *)local_2b8);
          if (wVar3 != L';') {
            pSVar4 = (StreamException *)__cxa_allocate_exception(0x28);
            Stream::unexpected(pSVar4,(Stream *)local_2b8,wVar3);
            __cxa_throw(pSVar4,&StreamException::typeinfo,StreamException::~StreamException);
          }
          Stream::get((Stream *)local_2b8);
          Encoder::Encoder(&local_2e0);
          std::__cxx11::string::string((string *)&local_278,local_300,&local_3b1);
          Encoder::wcstombs((Encoder *)&local_258,(char *)&local_2e0,(wchar_t *)&local_380,
                            (size_t)__n);
          anon_unknown.dwarf_423ae0::make_include_path((string *)local_3a8,&local_278,&local_258);
          machine_id = parse(local_3b0,(char *)local_3a8,machine_id);
          if (local_3a8 != (undefined1  [8])(local_3a0 + 8)) {
            operator_delete((void *)local_3a8);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258._M_dataplus._M_p != &local_258.field_2) {
            operator_delete(local_258._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._M_dataplus._M_p != &local_278.field_2) {
            operator_delete(local_278._M_dataplus._M_p);
          }
          if (local_380 != (undefined **)local_370) {
            operator_delete(local_380);
          }
        }
        else {
          ATNMachine<unsigned_char>::ATNMachine
                    ((ATNMachine<unsigned_char> *)local_3a8,machine_id,(Stream *)local_2b8);
          if ((local_3b0->m_root_id).m_id._M_string_length == 0) {
            std::__cxx11::wstring::_M_assign(local_308);
          }
          local_380 = &PTR__Identifier_001c8d10;
          local_378 = local_368;
          std::__cxx11::wstring::_M_construct<wchar_t*>
                    ((wstring *)&local_378,local_330.m_id._M_dataplus._M_p,
                     local_330.m_id._M_dataplus._M_p + local_330.m_id._M_string_length);
          local_358 = &PTR__ATNMachine_001c9518;
          local_350.
          super__Vector_base<Centaurus::ATNNode<unsigned_char>,_std::allocator<Centaurus::ATNNode<unsigned_char>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)local_3a0._0_8_;
          local_350.
          super__Vector_base<Centaurus::ATNNode<unsigned_char>,_std::allocator<Centaurus::ATNNode<unsigned_char>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_3a0._8_8_;
          local_350.
          super__Vector_base<Centaurus::ATNNode<unsigned_char>,_std::allocator<Centaurus::ATNNode<unsigned_char>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_3a0._16_8_;
          local_3a0._0_16_ = ZEXT816(0) << 0x20;
          local_3a0._16_8_ = (pointer)0x0;
          local_338 = local_388;
          std::
          _Hashtable<Centaurus::Identifier,std::pair<Centaurus::Identifier_const,Centaurus::ATNMachine<unsigned_char>>,std::allocator<std::pair<Centaurus::Identifier_const,Centaurus::ATNMachine<unsigned_char>>>,std::__detail::_Select1st,std::equal_to<Centaurus::Identifier>,std::hash<Centaurus::Identifier>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::_M_emplace<std::pair<Centaurus::Identifier,Centaurus::ATNMachine<unsigned_char>>>
                    (local_2e8,&local_380);
          local_358 = &PTR__ATNMachine_001c9518;
          std::
          vector<Centaurus::ATNNode<unsigned_char>,_std::allocator<Centaurus::ATNNode<unsigned_char>_>_>
          ::~vector(&local_350);
          local_380 = &PTR__Identifier_001c8d10;
          if (local_378 != local_368) {
            operator_delete(local_378);
          }
          std::vector<Centaurus::Identifier,_std::allocator<Centaurus::Identifier>_>::push_back
                    (local_2f0,&local_330);
          machine_id = machine_id + 1;
          local_3a8 = (undefined1  [8])&PTR__ATNMachine_001c9518;
          std::
          vector<Centaurus::ATNNode<unsigned_char>,_std::allocator<Centaurus::ATNNode<unsigned_char>_>_>
          ::~vector((vector<Centaurus::ATNNode<unsigned_char>,_std::allocator<Centaurus::ATNNode<unsigned_char>_>_>
                     *)local_3a0);
        }
      }
      local_330._vptr_Identifier = (_func_int **)&PTR__Identifier_001c8d10;
      if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
           *)local_330.m_id._M_dataplus._M_p != &local_330.m_id.field_2) {
        operator_delete(local_330.m_id._M_dataplus._M_p);
      }
    }
    if (wVar1 == L'\0') {
      local_2b8 = (undefined1  [8])&PTR__Stream_001c8898;
      if (local_2b0._M_p != local_2a0) {
        operator_delete(local_2b0._M_p);
      }
      if (local_2d8 != local_2c8) {
        operator_delete(local_2d8);
      }
      std::wifstream::~wifstream(local_238);
      return machine_id;
    }
  } while( true );
}

Assistant:

int Grammar<TCHAR>::parse(const char *filename, int machine_id)
{
    std::wifstream grammar_file(filename, std::ios::in);

    std::wstring grammar_str(std::istreambuf_iterator<wchar_t>(grammar_file), {});

    Stream stream(std::move(grammar_str));

    while (1)
    {
        wchar_t ch = stream.skip_whitespace();

        if (ch == L'\0')
            break;

        if (machine_id >= 65536)
            throw stream.toomany(65535);

        Identifier id(stream);

        if (id == L"grammar")
        {
            stream.skip_whitespace();

            m_grammar_name.parse(stream);

            wchar_t ch = stream.skip_whitespace();

            if (ch != L';')
                throw stream.unexpected(ch);
            stream.discard();
        }
        /*else if (id == L"options")
        {
            GrammarOptions options(stream);
        }
		else if (id == L"fragment")
		{
			Identifier frag_id(stream);

			ATNMachine<TCHAR> atn(-1, stream);

			fragments.emplace(frag_id, std::move(atn));
		}*/
        else if (id == L"include")
        {
            wchar_t ch = stream.skip_whitespace();

            if (ch != L'"')
                throw stream.unexpected(ch);
            stream.discard();

            std::wstring wide_path;

            for (ch = stream.get(); ch != L'"'; ch = stream.get())
            {
                wide_path.push_back(ch);
            }

            ch = stream.skip_whitespace();
            if (ch != L';')
                throw stream.unexpected(ch);
            stream.discard();

            Encoder enc{};

            machine_id = parse(make_include_path(filename, enc.wcstombs(wide_path)), machine_id);
        }
        else
        {
            ATNMachine<TCHAR> atn(machine_id++, stream);

            if (m_root_id.str().empty())
                m_root_id = id;

            m_networks.insert(std::pair<Identifier, ATNMachine<TCHAR> >(id, std::move(atn)));

            m_identifiers.push_back(id);
        }

        //m_networks.emplace(Identifier(stream), ATN<TCHAR>(stream));
    }
    return machine_id;
}